

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

Func * __thiscall
Inline::BuildInlinee
          (Inline *this,JITTimeFunctionBody *funcBody,FunctionJITTimeInfo *inlineeJITData,
          FunctionJITRuntimeInfo *inlineeRuntimeData,RegSlot returnRegSlot,Instr *callInstr,
          uint recursiveInlineDepth)

{
  Func *parentFunc;
  code *pcVar1;
  Func *polymorphicInlineCacheInfo;
  FunctionJITRuntimeInfo *runtimeInfo;
  bool bVar2;
  ExecutionMode EVar3;
  uint32 postCallByteCodeOffset;
  undefined4 *puVar4;
  ProfiledInstr *pPVar5;
  JitArenaAllocator *pJVar6;
  JITTimeWorkItem *pJVar7;
  CodeGenWorkItemIDL *pCVar8;
  intptr_t funcBodyAddr;
  Func *this_00;
  ThreadContextInfo *threadContextInfo;
  ScriptContextInfo *scriptContextInfo;
  JITOutput *this_01;
  JITOutputIDL *outputData;
  void *codeGenAllocators;
  ScriptContextProfiler *codeGenProfiler;
  TrackAllocData local_120;
  Func *local_f8;
  Func *inlinee;
  JITTimePolymorphicInlineCacheInfo *entryPointPolymorphicInlineCacheInfo;
  undefined8 local_e0;
  TrackAllocData local_d8;
  JITTimeWorkItem *local_b0;
  JITTimeWorkItem *jitWorkItem;
  undefined8 local_a0;
  TrackAllocData local_98;
  CodeGenWorkItemIDL *local_70;
  CodeGenWorkItemIDL *workItemData;
  Instr *pIStack_60;
  ProfileId callSiteId;
  Instr *callInstr_local;
  FunctionJITRuntimeInfo *pFStack_50;
  RegSlot returnRegSlot_local;
  FunctionJITRuntimeInfo *inlineeRuntimeData_local;
  FunctionJITTimeInfo *inlineeJITData_local;
  JITTimeFunctionBody *funcBody_local;
  Inline *this_local;
  
  pIStack_60 = callInstr;
  callInstr_local._4_4_ = returnRegSlot;
  pFStack_50 = inlineeRuntimeData;
  inlineeRuntimeData_local = (FunctionJITRuntimeInfo *)inlineeJITData;
  inlineeJITData_local = (FunctionJITTimeInfo *)funcBody;
  funcBody_local = (JITTimeFunctionBody *)this;
  bVar2 = IR::Instr::IsProfiledInstr(callInstr);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x590,"(callInstr->IsProfiledInstr())","callInstr->IsProfiledInstr()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pPVar5 = IR::Instr::AsProfiledInstr(pIStack_60);
  workItemData._6_2_ = (pPVar5->u).field_3.fldInfoData.f1;
  pJVar6 = this->topFunc->m_alloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_98,(type_info *)&CodeGenWorkItemIDL::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
             ,0x593);
  pJVar6 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar6,&local_98);
  jitWorkItem = (JITTimeWorkItem *)Memory::JitArenaAllocator::Alloc;
  local_a0 = 0;
  local_70 = (CodeGenWorkItemIDL *)new<Memory::JitArenaAllocator>(0x60,pJVar6,0x4e98c0);
  bVar2 = Func::IsJitInDebugMode(this->topFunc);
  local_70->isJitInDebugMode = bVar2;
  local_70->type = '\0';
  pJVar7 = Func::GetWorkItem(this->topFunc);
  EVar3 = JITTimeWorkItem::GetJitMode(pJVar7);
  local_70->jitMode = EVar3;
  pJVar7 = Func::GetWorkItem(this->topFunc);
  pCVar8 = JITTimeWorkItem::GetWorkItemData(pJVar7);
  local_70->nativeDataAddr = pCVar8->nativeDataAddr;
  local_70->loopNumber = 0xffffffff;
  local_70->jitData = (FunctionJITTimeDataIDL *)inlineeRuntimeData_local;
  pJVar6 = this->topFunc->m_alloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_d8,(type_info *)&JITTimeWorkItem::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
             ,0x59c);
  pJVar6 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar6,&local_d8);
  entryPointPolymorphicInlineCacheInfo =
       (JITTimePolymorphicInlineCacheInfo *)Memory::JitArenaAllocator::Alloc;
  local_e0 = 0;
  pJVar7 = (JITTimeWorkItem *)new<Memory::JitArenaAllocator>(0x1e0,pJVar6,0x4e98c0);
  JITTimeWorkItem::JITTimeWorkItem(pJVar7,local_70);
  local_b0 = pJVar7;
  pJVar7 = Func::GetWorkItem(this->topFunc);
  funcBodyAddr = JITTimeFunctionBody::GetAddr((JITTimeFunctionBody *)inlineeJITData_local);
  inlinee = (Func *)JITTimeWorkItem::GetInlineePolymorphicInlineCacheInfo(pJVar7,funcBodyAddr);
  pJVar6 = this->topFunc->m_alloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_120,(type_info *)&Func::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
             ,0x5c7);
  pJVar6 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar6,&local_120);
  this_00 = (Func *)new<Memory::JitArenaAllocator>(0x420,pJVar6,0x4e98c0);
  pJVar7 = local_b0;
  pJVar6 = this->topFunc->m_alloc;
  threadContextInfo = Func::GetThreadContextInfo(this->topFunc);
  scriptContextInfo = Func::GetScriptContextInfo(this->topFunc);
  this_01 = Func::GetJITOutput(this->topFunc);
  outputData = JITOutput::GetOutputData(this_01);
  runtimeInfo = pFStack_50;
  polymorphicInlineCacheInfo = inlinee;
  codeGenAllocators = Func::GetCodeGenAllocators(this->topFunc);
  codeGenProfiler = Func::GetCodeGenProfiler(this->topFunc);
  bVar2 = Func::IsBackgroundJIT(this->topFunc);
  parentFunc = pIStack_60->m_func;
  postCallByteCodeOffset = IR::Instr::GetByteCodeOffset(pIStack_60->m_next);
  Func::Func(this_00,pJVar6,pJVar7,threadContextInfo,scriptContextInfo,outputData,
             (EntryPointInfo *)0x0,runtimeInfo,
             (JITTimePolymorphicInlineCacheInfo *)polymorphicInlineCacheInfo,codeGenAllocators,
             codeGenProfiler,bVar2,parentFunc,postCallByteCodeOffset,callInstr_local._4_4_,false,
             workItemData._6_2_,false);
  local_f8 = this_00;
  BuildIRForInlinee(this,this_00,(JITTimeFunctionBody *)inlineeJITData_local,pIStack_60,false,
                    recursiveInlineDepth);
  return local_f8;
}

Assistant:

Func *
Inline::BuildInlinee(JITTimeFunctionBody* funcBody, const FunctionJITTimeInfo * inlineeJITData, const FunctionJITRuntimeInfo * inlineeRuntimeData, Js::RegSlot returnRegSlot, IR::Instr *callInstr, uint recursiveInlineDepth)
{
    Assert(callInstr->IsProfiledInstr());
    Js::ProfileId callSiteId = static_cast<Js::ProfileId>(callInstr->AsProfiledInstr()->u.profileId);

    CodeGenWorkItemIDL * workItemData = JitAnewStruct(this->topFunc->m_alloc, CodeGenWorkItemIDL);

    workItemData->isJitInDebugMode = this->topFunc->IsJitInDebugMode();
    workItemData->type = JsFunctionType;
    workItemData->jitMode = static_cast<char>(this->topFunc->GetWorkItem()->GetJitMode());
    workItemData->nativeDataAddr = this->topFunc->GetWorkItem()->GetWorkItemData()->nativeDataAddr;
    workItemData->loopNumber = Js::LoopHeader::NoLoop;

    workItemData->jitData = (FunctionJITTimeDataIDL*)(inlineeJITData);
    JITTimeWorkItem * jitWorkItem = JitAnew(this->topFunc->m_alloc, JITTimeWorkItem, workItemData);

    JITTimePolymorphicInlineCacheInfo * entryPointPolymorphicInlineCacheInfo = this->topFunc->GetWorkItem()->GetInlineePolymorphicInlineCacheInfo(funcBody->GetAddr());
#if !FLOATVAR
    Func * inlinee = JitAnew(this->topFunc->m_alloc,
                            Func,
                            this->topFunc->m_alloc,
                            jitWorkItem,
                            this->topFunc->GetThreadContextInfo(),
                            this->topFunc->GetScriptContextInfo(),
                            this->topFunc->GetJITOutput()->GetOutputData(),
                            nullptr,
                            inlineeRuntimeData,
                            entryPointPolymorphicInlineCacheInfo,
                            this->topFunc->GetCodeGenAllocators(),
                            this->topFunc->GetNumberAllocator(),
                            this->topFunc->GetCodeGenProfiler(),
                            this->topFunc->IsBackgroundJIT(),
                            callInstr->m_func,
                            callInstr->m_next->GetByteCodeOffset(),
                            returnRegSlot,
                            false,
                            callSiteId,
                            false);
#else
        Func * inlinee = JitAnew(this->topFunc->m_alloc,
                            Func,
                            this->topFunc->m_alloc,
                            jitWorkItem,
                            this->topFunc->GetThreadContextInfo(),
                            this->topFunc->GetScriptContextInfo(),
                            this->topFunc->GetJITOutput()->GetOutputData(),
                            nullptr,
                            inlineeRuntimeData,
                            entryPointPolymorphicInlineCacheInfo,
                            this->topFunc->GetCodeGenAllocators(),
                            this->topFunc->GetCodeGenProfiler(),
                            this->topFunc->IsBackgroundJIT(),
                            callInstr->m_func,
                            callInstr->m_next->GetByteCodeOffset(),
                            returnRegSlot,
                            false,
                            callSiteId,
                            false);
#endif

    BuildIRForInlinee(inlinee, funcBody, callInstr, false, recursiveInlineDepth);
    return inlinee;
}